

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nls.c
# Opt level: O3

int lmdif(custom_funcmult *funcmult,double *x,int M,int N,double *fvec,double *fjac,int ldfjac,
         int maxfev,double *diag,int mode,double factor,int nprint,double eps,double epsfcn,
         double ftol,double gtol,double xtol,int *nfev,int *njev,int *ipvt,double *qtf)

{
  size_t sVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  double dVar5;
  double *rdiag;
  double *x_00;
  long lVar6;
  ulong uVar7;
  double *pdVar8;
  int N_00;
  long lVar9;
  double *pdVar10;
  double *pdVar11;
  int iVar12;
  custom_funcmult *funcmult_00;
  ulong uVar13;
  double *pdVar14;
  uint uVar15;
  uint uVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double *in_stack_fffffffffffffe48;
  double local_a8;
  double local_98;
  double par;
  double *local_88;
  double local_80;
  double *local_78;
  double *local_70;
  double *local_68;
  ulong local_60;
  double *local_58;
  int local_4c;
  double local_48;
  int local_3c;
  ulong local_38;
  
  uVar18 = (ulong)(uint)N;
  local_38 = (ulong)N;
  sVar1 = local_38 * 8;
  par = (double)funcmult;
  local_88 = fvec;
  local_68 = fjac;
  local_58 = x;
  rdiag = (double *)malloc(sVar1);
  local_70 = (double *)malloc(sVar1);
  x_00 = (double *)malloc(sVar1);
  lVar6 = (long)M;
  local_78 = (double *)malloc(lVar6 * 8);
  pdVar10 = local_88;
  funcmult_00 = (custom_funcmult *)par;
  uVar15 = 0;
  *nfev = 0;
  *njev = 0;
  uVar16 = 0;
  if ((((((0 < (int)local_38) && (uVar16 = uVar15, N <= M)) && (M <= ldfjac)) &&
       ((0.0 <= ftol && (0.0 <= xtol)))) && (0.0 < factor)) && ((0 < maxfev && (0.0 <= gtol)))) {
    if (mode == 2) {
      uVar7 = 0;
      do {
        if (diag[uVar7] <= 0.0) {
          return 0;
        }
        uVar7 = uVar7 + 1;
      } while (uVar18 != uVar7);
    }
    local_60 = uVar18;
    local_38 = uVar18;
    (**(code **)par)(local_58,M,N,local_88,*(undefined8 *)((long)par + 8));
    *nfev = 1;
    local_a8 = enorm(pdVar10,M);
    uVar18 = local_38;
    local_98 = 0.0;
    iVar4 = (int)local_60;
    sVar1 = (ulong)(uint)M * 8;
    local_3c = 1;
    local_4c = M;
    while( true ) {
      pdVar8 = local_78;
      N_00 = (int)local_60;
      iVar12 = N_00;
      fdjac2(funcmult_00,local_58,local_4c,N_00,pdVar10,local_68,(int)in_stack_fffffffffffffe48,
             epsfcn,eps);
      *njev = *njev + N_00;
      qrfac(local_68,local_4c,N_00,iVar12,1,ipvt,(int)in_stack_fffffffffffffe48,rdiag,local_70,eps);
      if (local_3c == 1) {
        if (mode != 2) {
          uVar7 = 0;
          do {
            uVar19 = -(ulong)(local_70[uVar7] == 0.0);
            diag[uVar7] = (double)(uVar19 & 0x3ff0000000000000 | ~uVar19 & (ulong)local_70[uVar7]);
            uVar7 = uVar7 + 1;
          } while (local_38 != uVar7);
        }
        uVar7 = 0;
        do {
          x_00[uVar7] = diag[uVar7] * local_58[uVar7];
          uVar7 = uVar7 + 1;
        } while (local_38 != uVar7);
        local_80 = enorm(x_00,(int)local_60);
        local_48 = local_80 * factor;
        if ((local_48 == 0.0) && (!NAN(local_48))) {
          local_48 = factor;
        }
      }
      memcpy(pdVar8,local_88,sVar1);
      uVar19 = 0;
      uVar7 = (ulong)(uint)M;
      pdVar10 = pdVar8;
      pdVar11 = local_68;
      do {
        iVar12 = (iVar4 + 1) * (int)uVar19;
        dVar26 = local_68[iVar12];
        if (((dVar26 != 0.0) || (NAN(dVar26))) && ((long)uVar19 < lVar6)) {
          dVar20 = 0.0;
          uVar13 = 0;
          pdVar14 = pdVar11;
          do {
            dVar20 = dVar20 + *pdVar14 * pdVar10[uVar13];
            pdVar14 = pdVar14 + uVar18;
            uVar13 = uVar13 + 1;
          } while (uVar7 != uVar13);
          if ((long)uVar19 < lVar6) {
            uVar13 = 0;
            pdVar14 = pdVar11;
            do {
              pdVar10[uVar13] = *pdVar14 * (-dVar20 / dVar26) + pdVar10[uVar13];
              pdVar14 = pdVar14 + uVar18;
              uVar13 = uVar13 + 1;
            } while (uVar7 != uVar13);
          }
        }
        local_68[iVar12] = rdiag[uVar19];
        qtf[uVar19] = pdVar8[uVar19];
        uVar19 = uVar19 + 1;
        pdVar11 = pdVar11 + uVar18 + 1;
        pdVar10 = pdVar10 + 1;
        uVar7 = uVar7 - 1;
      } while (uVar19 != local_38);
      dVar26 = 0.0;
      uVar7 = local_38;
      if ((local_a8 != 0.0) || (NAN(local_a8))) {
        lVar17 = 1;
        uVar19 = 0;
        pdVar10 = local_68;
        do {
          dVar20 = local_70[ipvt[uVar19]];
          if ((dVar20 != 0.0) || (NAN(dVar20))) {
            dVar23 = 0.0;
            lVar9 = 0;
            pdVar8 = pdVar10;
            do {
              dVar23 = dVar23 + (qtf[lVar9] / local_a8) * *pdVar8;
              lVar9 = lVar9 + 1;
              pdVar8 = pdVar8 + uVar18;
            } while (lVar17 != lVar9);
            dVar26 = pmax(dVar26,ABS(dVar23 / dVar20));
            uVar7 = local_38;
          }
          uVar19 = uVar19 + 1;
          lVar17 = lVar17 + 1;
          pdVar10 = pdVar10 + 1;
        } while (uVar19 != uVar7);
      }
      pdVar10 = local_70;
      if (dVar26 <= gtol) break;
      if (mode != 2) {
        uVar19 = 0;
        do {
          dVar20 = pmax(diag[uVar19],pdVar10[uVar19]);
          diag[uVar19] = dVar20;
          uVar19 = uVar19 + 1;
        } while (local_38 != uVar19);
      }
      dVar27 = 0.0;
      dVar20 = local_48;
      dVar23 = local_80;
      while (pdVar8 = local_70, funcmult_00 = (custom_funcmult *)par, pdVar10 = local_88,
            local_80 = dVar23, local_48 = dVar20, dVar27 < 0.0001) {
        in_stack_fffffffffffffe48 = &local_98;
        lmpar(local_68,(int)uVar7,(int)local_60,ipvt,diag,qtf,dVar20,in_stack_fffffffffffffe48,rdiag
              ,local_70);
        uVar7 = 0;
        do {
          dVar20 = rdiag[uVar7];
          dVar23 = -dVar20;
          rdiag[uVar7] = dVar23;
          pdVar8[uVar7] = local_58[uVar7] - dVar20;
          x_00[uVar7] = diag[uVar7] * dVar23;
          uVar7 = uVar7 + 1;
        } while (local_38 != uVar7);
        dVar23 = enorm(x_00,(int)local_60);
        if (local_3c == 1) {
          local_48 = pmin(local_48,dVar23);
        }
        pdVar10 = local_78;
        (**(code **)par)(pdVar8,local_4c,local_60,local_78,*(undefined8 *)((long)par + 8));
        *nfev = *nfev + 1;
        dVar21 = enorm(pdVar10,local_4c);
        dVar25 = 1.0 - (dVar21 / local_a8) * (dVar21 / local_a8);
        uVar19 = -(ulong)(dVar21 * 0.1 < local_a8);
        dVar20 = (double)(~uVar19 & 0xbff0000000000000 | uVar19 & (ulong)dVar25);
        lVar17 = 1;
        uVar7 = 0;
        pdVar10 = local_68;
        do {
          x_00[uVar7] = 0.0;
          dVar24 = rdiag[ipvt[uVar7]];
          lVar9 = 0;
          pdVar11 = pdVar10;
          do {
            x_00[lVar9] = *pdVar11 * dVar24 + x_00[lVar9];
            lVar9 = lVar9 + 1;
            pdVar11 = pdVar11 + uVar18;
          } while (lVar17 != lVar9);
          uVar7 = uVar7 + 1;
          lVar17 = lVar17 + 1;
          pdVar10 = pdVar10 + 1;
        } while (uVar7 != local_38);
        dVar27 = enorm(x_00,(int)local_60);
        dVar5 = local_98;
        if (local_98 < 0.0) {
          dVar22 = sqrt(local_98);
        }
        else {
          dVar22 = SQRT(local_98);
        }
        dVar22 = (dVar22 * dVar23) / local_a8;
        dVar22 = dVar22 * dVar22;
        dVar29 = (dVar27 / local_a8) * (dVar27 / local_a8);
        dVar28 = dVar22 + dVar22 + dVar29;
        dVar27 = (double)(-(ulong)(dVar28 != 0.0) & (ulong)(dVar20 / dVar28));
        if (dVar27 <= 0.25) {
          dVar29 = dVar29 + dVar22;
          dVar20 = (double)(~-(ulong)(dVar20 < 0.0) &
                            (~-(ulong)(dVar20 < 0.0) & 0x3fe0000000000000 |
                            (ulong)dVar24 & -(ulong)(dVar20 < 0.0)) |
                           (ulong)((dVar29 * -0.5) / (dVar20 * 0.5 - dVar29)) &
                           -(ulong)(dVar20 < 0.0));
          dVar24 = 0.1;
          if (dVar21 * 0.1 < local_a8 && 0.1 <= dVar20) {
            dVar24 = dVar20;
          }
          dVar20 = pmin(local_48,dVar23 / 0.1);
          dVar20 = dVar20 * dVar24;
          local_98 = dVar5 / dVar24;
        }
        else if (((dVar5 == 0.0) && (!NAN(dVar5))) || (dVar20 = local_48, 0.75 <= dVar27)) {
          dVar20 = dVar23 + dVar23;
          local_98 = dVar5 * 0.5;
        }
        uVar7 = local_38;
        dVar23 = local_80;
        iVar12 = local_3c;
        if (0.0001 <= dVar27) {
          uVar7 = 0;
          do {
            dVar23 = pdVar8[uVar7];
            local_58[uVar7] = dVar23;
            pdVar8[uVar7] = dVar23 * diag[uVar7];
            uVar7 = uVar7 + 1;
          } while (local_38 != uVar7);
          local_48 = dVar20;
          memcpy(local_88,local_78,sVar1);
          uVar7 = local_60;
          dVar23 = enorm(pdVar8,(int)local_60);
          dVar20 = local_48;
          local_a8 = dVar21;
          iVar12 = local_3c + 1;
        }
        dVar21 = (double)(~uVar19 & 0x3ff0000000000000 | (ulong)ABS(dVar25) & uVar19);
        bVar2 = ftol < dVar21;
        bVar3 = ftol < dVar28;
        dVar25 = dVar27 * 0.5;
        dVar24 = dVar23 * xtol;
        if (((!bVar3 && !bVar2) && (dVar25 <= 1.0)) && (dVar20 <= dVar24)) {
          uVar16 = 3;
          goto LAB_00146f73;
        }
        if (((!bVar3 && !bVar2) && 1.0 >= dVar25) || (dVar20 <= dVar24)) {
          uVar16 = 2;
          if (dVar24 < dVar20) {
            uVar16 = (byte)~((bVar3 || bVar2) || 1.0 < dVar25) & 1;
          }
          goto LAB_00146f73;
        }
        uVar15 = (uint)(maxfev <= *nfev) * 5;
        uVar16 = 6;
        if (1.0 < dVar25) {
          uVar16 = uVar15;
        }
        if (eps < dVar28) {
          uVar16 = uVar15;
        }
        if (eps < dVar21) {
          uVar16 = uVar15;
        }
        if (dVar20 <= dVar23 * eps) {
          uVar16 = 7;
        }
        if (dVar26 <= eps) {
          uVar16 = 8;
        }
        local_3c = iVar12;
        if (uVar16 != 0) goto LAB_00146f73;
      }
    }
    uVar16 = 4;
LAB_00146f73:
    free(rdiag);
    free(local_70);
    free(x_00);
    free(local_78);
  }
  return uVar16;
}

Assistant:

int lmdif(custom_funcmult *funcmult, double *x, int M, int N, double *fvec, double *fjac, int ldfjac,
		int maxfev,double *diag,int mode,double factor,int nprint,double eps,double epsfcn,double ftol,double gtol,
		double xtol,int *nfev,int *njev,int *ipvt, double *qtf) {
	int info;
	int i,j,l,iter;
    double actred,delta,dirder,epsmch,fnorm,fnorm1,gnorm,one,par,pnorm,prered,p1,p5,p25,p75,p0001,ratio,
    sum,temp,temp1,temp2,xnorm,zero;
    double *wa1,*wa2,*wa3,*wa4;

    /*
     * 	*   This routine is a C translation of Fortran Code by
    *     argonne national laboratory. minpack project. march 1980.
     	  burton s. garbow, kenneth e. hillstrom, jorge j. more
     *  M is a positive integer input variable set to the number
c         of functions.
c
c       N is a positive integer input variable set to the number
c         of variables. N must not exceed M.
c
c       x is an array of length N. on input x must contain
c         an initial estimate of the solution vector. on output x
c         contains the final estimate of the solution vector.
c
c       fvec is an output array of length M which contains
c         the functions evaluated at the output x.
c
c       fjac is an output M by N array. the upper N by N submatrix
c         of fjac contains an upper triangular matrix r with
c         diagonal elements of nonincreasing magnitude such that
c
c                t     t           t
c               p *(jac *jac)*p = r *r,
c
c         where p is a permutation matrix and jac is the final
c         calculated jacobian. column j of p is column ipvt(j)
c         (see below) of the identity matrix. the lower trapezoidal
c         part of fjac contains information generated during
c         the computation of r.
c
c       ldfjac is a positive integer input variable not less than M
c         which specifies the leading dimension of the array fjac.
c
c       ftol is a nonnegative input variable. termination
c         occurs when both the actual and predicted relative
c         reductions in the sum of squares are at most ftol.
c         therefore, ftol measures the relative error desired
c         in the sum of squares.
c
c       xtol is a nonnegative input variable. termination
c         occurs when the relative error between two consecutive
c         iterates is at most xtol. therefore, xtol measures the
c         relative error desired in the approximate solution.
c
c       gtol is a nonnegative input variable. termination
c         occurs when the cosine of the angle between fvec and
c         any column of the jacobian is at most gtol in absolute
c         value. therefore, gtol measures the orthogonality
c         desired between the function vector and the columns
c         of the jacobian.
c
c       maxfev is a positive integer input variable. termination
c         occurs when the number of calls to fcn with iflag = 1
c         has reached maxfev.
c
c       epsfcn is an input variable used in determining a suitable
c         step length for the forward-difference approximation. this
c         approximation assumes that the relative errors in the
c         functions are of the order of epsfcn. if epsfcn is less
c         than the machine precision, it is assumed that the relative
c         errors in the functions are of the order of the machine
c         precision.
c
c       diag is an array of length N. if mode = 1 (see
c         below), diag is internally set. if mode = 2, diag
c         must contain positive entries that serve as
c         multiplicative scale factors for the variables.
c
c       mode is an integer input variable. if mode = 1, the
c         variables will be scaled internally. if mode = 2,
c         the scaling is specified by the input diag. other
c         values of mode are equivalent to mode = 1.
c
c       factor is a positive input variable used in determining the
c         initial step bound. this bound is set to the product of
c         factor and the euclidean norm of diag*x if nonzero, or else
c         to factor itself. in most cases factor should lie in the
c         interval (.1,100.).100. is a generally recommended value.
c
c       nprint is an integer input variable that enables controlled
c         printing of iterates if it is positive. in this case,
c         fcn is called with iflag = 0 at the beginning of the first
c         iteration and every nprint iterations thereafter and
c         immediately prior to return, with x, fvec, and fjac
c         available for printing. fvec and fjac should not be
c         altered. if nprint is not positive, no special calls
c         of fcn with iflag = 0 are made.
c
c       info is an integer output variable. if the user has
c         terminated execution, info is set to the (negative)
c         value of iflag. see description of fcn. otherwise,
c         info is set as follows.
c
c         info = 0  improper input parameters.
c
c         info = 1  both actual and predicted relative reductions
c                   in the sum of squares are at most ftol.
c
c         info = 2  relative error between two consecutive iterates
c                   is at most xtol.
c
c         info = 3  conditions for info = 1 and info = 2 both hold.
c
c         info = 4  the cosine of the angle between fvec and any
c                   column of the jacobian is at most gtol in
c                   absolute value.
c
c         info = 5  number of calls to fcn with iflag = 1 has
c                   reached maxfev.
c
c         info = 6  ftol is too small. no further reduction in
c                   the sum of squares is possible.
c
c         info = 7  xtol is too small. no further improvement in
c                   the approximate solution x is possible.
c
c         info = 8  gtol is too small. fvec is orthogonal to the
c                   columns of the jacobian to machine precision.
c
c       nfev is an integer output variable set to the number of
c         calls to fcn with iflag = 1.
c
c       njev is an integer output variable set to the number of
c         calls to fcn with iflag = 2.
c
c       ipvt is an integer output array of length N. ipvt
c         defines a permutation matrix p such that jac*p = q*r,
c         where jac is the final calculated jacobian, q is
c         orthogonal (not stored), and r is upper triangular
c         with diagonal elements of nonincreasing magnitude.
c         column j of p is column ipvt(j) of the identity matrix.
c
c       qtf is an output array of length N which contains
c         the first n elements of the vector (q transpose)*fvec.
     */

	wa1 = (double*) malloc(sizeof(double) *N);
	wa2 = (double*) malloc(sizeof(double) *N);
	wa3 = (double*) malloc(sizeof(double) *N);
	wa4 = (double*) malloc(sizeof(double) *M);

    one = 1.0;
    zero = 0.0;
    p1 = 1.0e-1; p5 = 5.0e-1; p25 = 2.5e-1; p75 = 7.5e-1; p0001 = 1.0e-4;
    epsmch = eps;

    info = 0;
    *nfev = 0;
    *njev = 0;

    if (N <= 0 || M < N || ldfjac < M || ftol < zero || xtol < zero || gtol < zero || maxfev <= 0 || factor <= zero) {
    	return info;
    }

    if (mode == 2) {
		for(j = 0; j < N;++j) {
			if (diag[j] <= 0.0) {
				return info;
			}
		}
    }

    //     evaluate the function at the starting point
    //     and calculate its norm.

    FUNCMULT_EVAL(funcmult,x,M,N,fvec);
    *nfev= 1;
    fnorm = enorm(fvec,M);

    //     initialize levenberg-marquardt parameter and iteration counter.
    par = zero;
    iter = 1;
    ratio = zero;

    //     beginning of the outer loop.

    while(1) {
    	//        calculate the jacobian matrix.
    	ratio = zero;
    	fdjac2(funcmult,x,M,N,fvec,fjac,ldfjac,epsfcn,epsmch);
    	*njev = *njev + N;

    	//        compute the qr factorization of the jacobian.

    	qrfac(fjac,M,N,ldfjac,1,ipvt,N,wa1,wa2,eps);

    	//        on the first iteration and if mode is 1, scale according
    	//        to the norms of the columns of the initial jacobian.

    	if (iter == 1) {//80
    		if (mode != 2) {//60
    			for(j = 0;j < N;++j) {
    				diag[j] = wa2[j];
    				if (wa2[j] == zero) {
    					diag[j] = one;
    				}
    			}
    		}//60

    		//        on the first iteration, calculate the norm of the scaled x
    		//        and initialize the step bound delta.

    		for(j = 0; j < N;++j) {
    			wa3[j] = diag[j]*x[j];
    		}
            xnorm = enorm(wa3,N);
            delta = factor*xnorm;

            if (delta == zero) {
            	delta = factor;
            }

    	}//80

        //        form (q transpose)*fvec and store the first n components in
        //        qtf.

    	for(i = 0; i < M;++i) {
    		wa4[i] = fvec[i];
    	}

    	for(j = 0; j < N;++j) {//130
    		if (fjac[j*N+j] != zero) {//120
    			sum = zero;
    			for(i = j; i < M;++i) {//100
    				sum = sum + fjac[i*N+j]*wa4[i];
    			}//100
    			temp = -sum/fjac[j*N+j];
    			for(i = j; i < M;++i) {//110
    				wa4[i] = wa4[i] + fjac[i*N+j]*temp;
    			}//110
    		}//120
            fjac[j*N+j] = wa1[j];
            qtf[j] = wa4[j];
    	}//130

    	//        compute the norm of the scaled gradient.
    	gnorm = zero;

    	if (fnorm != zero) {//170
    		for(j = 0; j < N;++j) {//160
    			l = ipvt[j];
    			if (wa2[l] != zero) {//150
    				sum = zero;
    				for(i = 0; i <= j;++i) { //140
    					sum = sum + fjac[i*N+j]*(qtf[i]/fnorm);
    				}//140
    				gnorm = pmax(gnorm,fabs(sum/wa2[l]));
    			}//150
    		}//160
    	}//170

    	//        test for convergence of the gradient norm.
    	if (gnorm <= gtol) {
    		info = 4;
    	}
    	if (info != 0) {
    		break;
    	}

    	//        rescale if necessary.
    	if (mode != 2) { //190
    		for(j = 0; j < N;++j) {
    			diag[j] = pmax(diag[j],wa2[j]);
    		}
    	}//190

    	//        beginning of the inner loop.

    	while(ratio < p0001) {
    		//           determine the levenberg-marquardt parameter.
    		lmpar(fjac,ldfjac,N,ipvt,diag,qtf,delta,&par,wa1,wa2);
    		//           store the direction p and x + p. calculate the norm of p.
    		for(j = 0; j < N;++j) {
                wa1[j] = -wa1[j];
                wa2[j] = x[j] + wa1[j];
                wa3[j] = diag[j]*wa1[j];
    		}
			
    		pnorm = enorm(wa3,N);
    		//           on the first iteration, adjust the initial step bound.
    		if (iter == 1) {
    			delta = pmin(delta,pnorm);
    		}
    		//           evaluate the function at x + p and calculate its norm.

    		FUNCMULT_EVAL(funcmult,wa2,M,N,wa4);
    		*nfev = *nfev + 1;
    		fnorm1 = enorm(wa4,M);

    		//           compute the scaled actual reduction.

            actred = -one;
            if (p1*fnorm1 < fnorm) {
            	actred = one - (fnorm1/fnorm)*(fnorm1/fnorm);
            }

            //           compute the scaled predicted reduction and
            //           the scaled directional derivative.

            for(j = 0; j < N;++j) {
                wa3[j] = zero;
                l = ipvt[j];
                temp = wa1[l];
                for(i = 0;i <= j;++i) {
                	wa3[i] = wa3[i] + fjac[i*N+j]*temp;
                }
            }

            temp1 = enorm(wa3,N);
            temp1 = temp1/fnorm;
            temp2 = (sqrt(par)*pnorm)/fnorm;
            prered = temp1*temp1 + temp2*temp2/p5;
            dirder = -(temp1*temp1 + temp2*temp2);
            //           compute the ratio of the actual to the predicted
            //           reduction.
            ratio = zero;
            if (prered != zero) {
            	ratio = actred/prered;
            }
            //           update the step bound.
			

            if (ratio <= p25) {//240
            	if (actred >= zero) {
            		temp = p5;
            	}
            	if (actred < zero) {
            		temp = p5*dirder/(dirder + p5*actred);
            	}
            	if (p1*fnorm1 >= fnorm || temp < p1) {
            		temp = p1;
            	}
                delta = temp*pmin(delta,pnorm/p1);
                par = par/temp;
            } else if (par == zero || ratio >= p75){//240 - 260
                delta = pnorm/p5;
                par = p5*par;
            }//260

            //           test for successful iteration.

            if (ratio >= p0001) {//290
            	//           successful iteration. update x, fvec, and their norms.
            	for(j = 0; j < N;++j) {
                    x[j] = wa2[j];
                    wa2[j] = diag[j]*x[j];
            	}
            	for(i = 0; i < M;++i) {
            		fvec[i] = wa4[i];
            	}
                xnorm = enorm(wa2,N);
                fnorm = fnorm1;
                iter = iter + 1;
            }//290
            //           tests for convergence.
            if ((fabs(actred) <= ftol) && (prered <= ftol) && (p5*ratio <= one)) {
            	info = 1;
            }
            if (delta <= xtol*xnorm) {
            	info = 2;
            }
            if ((fabs(actred) <= ftol) && (prered <= ftol) && (p5*ratio <= one) && (info == 2)) {
            	info = 3;
            }
            if (info != 0) {
            	break;
            }

            //           tests for termination and stringent tolerances.
            if (*nfev >= maxfev) {
            	info = 5;
            }
            if ((fabs(actred) <= epsmch) && (prered <= epsmch) && (p5*ratio <= one)) {
            	info = 6;
            }
            if (delta <= epsmch*xnorm) {
            	info = 7;
            }
            if (gnorm <= epsmch) {
            	info = 8;
            }
            if (info != 0) {
            	break;
            }

    	}

        if (info != 0) {
        	break;
        }


    }


    free(wa1);
    free(wa2);
    free(wa3);
    free(wa4);

	return info;
}